

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

void iff_setop(uint8_t *list,uint8_t op,size_t pos)

{
  byte bVar1;
  
  if (op < 4) {
    bVar1 = (char)pos * '\x02' & 6;
    list[pos >> 2] = op << bVar1 | ~(byte)(3 << bVar1) & list[pos >> 2];
    return;
  }
  __assert_fail("op <= IFF_RECORD_MASK",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                ,0x12f,"void iff_setop(uint8_t *, uint8_t, size_t)");
}

Assistant:

static void
iff_setop(uint8_t *list, uint8_t op, size_t pos)
{
    uint8_t *item;
    uint8_t mask = IFF_RECORD_MASK;

    assert(op <= IFF_RECORD_MASK); /* max 2 bits */

    item = &list[pos / IFF_RECORDS_IN_BYTE];
    mask = mask << IFF_RECORD_BITS * (pos % IFF_RECORDS_IN_BYTE);
    *item = (*item) & ~mask;
    *item = (*item) | (op << IFF_RECORD_BITS * (pos % IFF_RECORDS_IN_BYTE));
}